

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O0

void astcenc_context_free(astcenc_context *ctxo)

{
  astcenc_context *in_RDI;
  astcenc_contexti *ctx;
  astcenc_context *this;
  
  if (in_RDI != (astcenc_context *)0x0) {
    this = in_RDI;
    aligned_free<compression_working_buffers>((compression_working_buffers *)0x54618c);
    aligned_free<block_size_descriptor>((block_size_descriptor *)0x54619d);
    if (in_RDI != (astcenc_context *)0x0) {
      astcenc_context::~astcenc_context(this);
      operator_delete(in_RDI,0x2e8);
    }
  }
  return;
}

Assistant:

void astcenc_context_free(
	astcenc_context* ctxo
) {
	if (ctxo)
	{
		astcenc_contexti* ctx = &ctxo->context;
		aligned_free<compression_working_buffers>(ctx->working_buffers);
		aligned_free<block_size_descriptor>(ctx->bsd);
#if defined(ASTCENC_DIAGNOSTICS)
		delete ctx->trace_log;
#endif
		delete ctxo;
	}
}